

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

TestInfo *
testing::internal::MakeAndRegisterTestInfo
          (char *test_suite_name,char *name,char *type_param,char *value_param,
          CodeLocation *code_location,TypeId fixture_class_id,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc,TestFactoryBase *factory)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  TestInfo *test_info;
  CodeLocation local_b0;
  string local_88;
  string local_68;
  TypeId local_48;
  TestInfo *local_40;
  allocator<char> local_32;
  allocator<char> local_31;
  
  local_48 = fixture_class_id;
  local_40 = (TestInfo *)operator_new(0x110);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,test_suite_name,&local_32);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,name,&local_31);
  paVar1 = &local_b0.file.field_2;
  pcVar2 = (code_location->file)._M_dataplus._M_p;
  local_b0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + (code_location->file)._M_string_length);
  test_info = local_40;
  local_b0.line = code_location->line;
  TestInfo::TestInfo(local_40,&local_88,&local_68,type_param,value_param,&local_b0,local_48,factory)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0.file._M_dataplus._M_p,local_b0.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  UnitTest::GetInstance();
  UnitTestImpl::AddTestInfo(UnitTest::GetInstance::instance.impl_,set_up_tc,tear_down_tc,test_info);
  return test_info;
}

Assistant:

TestInfo* MakeAndRegisterTestInfo(
    const char* test_suite_name, const char* name, const char* type_param,
    const char* value_param, CodeLocation code_location,
    TypeId fixture_class_id, SetUpTestSuiteFunc set_up_tc,
    TearDownTestSuiteFunc tear_down_tc, TestFactoryBase* factory) {
  TestInfo* const test_info =
      new TestInfo(test_suite_name, name, type_param, value_param,
                   code_location, fixture_class_id, factory);
  GetUnitTestImpl()->AddTestInfo(set_up_tc, tear_down_tc, test_info);
  return test_info;
}